

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddLine(ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImU32 col,float thickness)

{
  ImVec2 IVar1;
  ImVec2 *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if (0xffffff < col) {
    IVar1 = *p1;
    iVar7 = (this->_Path).Size;
    iVar8 = (this->_Path).Capacity;
    if (iVar7 == iVar8) {
      iVar7 = iVar7 + 1;
      if (iVar8 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar8 / 2 + iVar8;
      }
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar8 < iVar7) {
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        pIVar2 = (this->_Path).Data;
        if (pIVar2 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar2,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar7;
      }
    }
    IVar3.y = IVar1.y + 0.5;
    IVar3.x = IVar1.x + 0.5;
    (this->_Path).Data[(this->_Path).Size] = IVar3;
    iVar8 = (this->_Path).Size;
    iVar6 = (this->_Path).Capacity;
    iVar7 = iVar8 + 1;
    (this->_Path).Size = iVar7;
    IVar1 = *p2;
    if (iVar7 == iVar6) {
      iVar8 = iVar8 + 2;
      if (iVar6 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar6 / 2 + iVar6;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar6 < iVar8) {
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        pIVar2 = (this->_Path).Data;
        if (pIVar2 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar2,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
      }
    }
    IVar4.y = IVar1.y + 0.5;
    IVar4.x = IVar1.x + 0.5;
    (this->_Path).Data[(this->_Path).Size] = IVar4;
    iVar7 = (this->_Path).Size + 1;
    (this->_Path).Size = iVar7;
    AddPolyline(this,(this->_Path).Data,iVar7,col,0,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& p1, const ImVec2& p2, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(p1 + ImVec2(0.5f, 0.5f));
    PathLineTo(p2 + ImVec2(0.5f, 0.5f));
    PathStroke(col, 0, thickness);
}